

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket_p.cpp
# Opt level: O1

void __thiscall BamTools::Internal::TcpSocket::TcpSocket(TcpSocket *this)

{
  this->m_mode = NotOpen;
  (this->m_hostName)._M_dataplus._M_p = (pointer)&(this->m_hostName).field_2;
  (this->m_hostName)._M_string_length = 0;
  (this->m_hostName).field_2._M_local_buf[0] = '\0';
  this->m_remotePort = 0;
  HostAddress::HostAddress(&this->m_remoteAddress);
  this->m_engine = (TcpSocketEngine *)0x0;
  this->m_cachedSocketDescriptor = -1;
  RollingBuffer::RollingBuffer(&this->m_readBuffer,0x10000);
  this->m_error = NoError;
  this->m_state = UnconnectedState;
  (this->m_errorString)._M_dataplus._M_p = (pointer)&(this->m_errorString).field_2;
  (this->m_errorString)._M_string_length = 0;
  (this->m_errorString).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

TcpSocket::TcpSocket()
    : m_mode(IBamIODevice::NotOpen)
    //    , m_localPort(0)
    , m_remotePort(0)
    , m_engine(0)
    , m_cachedSocketDescriptor(-1)
    , m_readBuffer(DEFAULT_BUFFER_SIZE)
    , m_error(TcpSocket::NoError)
    , m_state(TcpSocket::UnconnectedState)
{}